

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O0

JsonObject * __thiscall json::JsonObject::setChild<json::JsonObject>(JsonObject *this,string *name)

{
  JsonObject *pJVar1;
  type this_00;
  mapped_type *this_01;
  Value local_48;
  JsonObject *local_38;
  JsonObject *ref;
  unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> local_20;
  unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> child;
  string *name_local;
  JsonObject *this_local;
  
  child._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
  super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
  super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<json::JsonNode,_std::default_delete<json::JsonNode>,_true,_true>)
       (__uniq_ptr_data<json::JsonNode,_std::default_delete<json::JsonNode>,_true,_true>)name;
  pJVar1 = (JsonObject *)operator_new(0x50);
  JsonObject(pJVar1,&this->super_JsonNode);
  std::unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>>::
  unique_ptr<std::default_delete<json::JsonNode>,void>
            ((unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>> *)&local_20,
             (pointer)pJVar1);
  this_00 = std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::operator*
                      (&local_20);
  local_38 = JsonNode::operator_cast_to_JsonObject_(this_00);
  std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::unique_ptr
            (&local_48.node,&local_20);
  local_48.orderIndex = this->childCounter;
  this->childCounter = local_48.orderIndex + 1;
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>_>
            ::operator[](&this->children,
                         (key_type *)
                         child._M_t.
                         super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>
                         .super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl);
  Value::operator=(this_01,&local_48);
  Value::~Value(&local_48);
  pJVar1 = local_38;
  std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::~unique_ptr(&local_20);
  return pJVar1;
}

Assistant:

ChildType &JsonObject::setChild(const std::string &name)
    {
        std::unique_ptr<JsonNode> child(new ChildType(this));
        ChildType &ref = *child; // We take a reference to the child before we move it into the unordered_map.
        children[name] = {std::move(child), childCounter++};
        return ref;
    }